

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenCallInsertOperandAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef operandExpr)

{
  if (expr->_id != CallId) {
    __assert_fail("expression->is<Call>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x8de,
                  "void BinaryenCallInsertOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 1),
               (ulong)index,operandExpr);
    return;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x8df,
                "void BinaryenCallInsertOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenCallInsertOperandAt(BinaryenExpressionRef expr,
                                 BinaryenIndex index,
                                 BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Call>());
  assert(operandExpr);
  static_cast<Call*>(expression)
    ->operands.insertAt(index, (Expression*)operandExpr);
}